

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O0

void crnlib::LzmaEnc_Destruct(CLzmaEnc *p,ISzAlloc *alloc,ISzAlloc *allocBig)

{
  ISzAlloc *allocBig_local;
  ISzAlloc *alloc_local;
  CLzmaEnc *p_local;
  
  MatchFinder_Free(&p->matchFinderBase,allocBig);
  LzmaEnc_FreeLits(p,alloc);
  RangeEnc_Free(&p->rc,alloc);
  return;
}

Assistant:

void LzmaEnc_Destruct(CLzmaEnc* p, ISzAlloc* alloc, ISzAlloc* allocBig) {
#ifdef COMPRESS_MF_MT
  MatchFinderMt_Destruct(&p->matchFinderMt, allocBig);
#endif
  MatchFinder_Free(&p->matchFinderBase, allocBig);
  LzmaEnc_FreeLits(p, alloc);
  RangeEnc_Free(&p->rc, alloc);
}